

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_assignAllIdsBlankModel_Test::~Annotator_assignAllIdsBlankModel_Test
          (Annotator_assignAllIdsBlankModel_Test *this)

{
  Annotator_assignAllIdsBlankModel_Test *this_local;
  
  ~Annotator_assignAllIdsBlankModel_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, assignAllIdsBlankModel)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringNoIds);
    auto annotator = libcellml::Annotator::create();

    EXPECT_TRUE(annotator->assignAllIds(model));
    EXPECT_EQ(size_t(0), annotator->errorCount());

    libcellml::ModelPtr nullModel;
    EXPECT_FALSE(annotator->assignAllIds(nullModel));
    EXPECT_EQ(size_t(0), annotator->errorCount());
}